

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> __thiscall
Parser::parseDirective(Parser *this,DirectiveMap *directiveSet)

{
  bool bVar1;
  Token *this_00;
  Identifier *this_01;
  pointer pvVar2;
  Architecture *pAVar3;
  Token *pTVar4;
  unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_DirectiveEntry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_DirectiveEntry>_>_>
  *in_RDX;
  unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> local_58;
  unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> result;
  DirectiveEntry *directive;
  _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_DirectiveEntry>,_false,_true>
  it;
  pair<std::__detail::_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_DirectiveEntry>,_false,_true>,_std::__detail::_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_DirectiveEntry>,_false,_true>_>
  matchRange;
  string *stringValue;
  Token *tok;
  DirectiveMap *directiveSet_local;
  Parser *this_local;
  
  this_00 = peekToken((Parser *)directiveSet,0);
  if (this_00->type == Identifier) {
    this_01 = Token::identifierValue(this_00);
    matchRange.second.
    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_DirectiveEntry>,_true>
    ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_DirectiveEntry>,_true>
               )Identifier::string_abi_cxx11_(this_01);
    _it = std::
          unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_DirectiveEntry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_DirectiveEntry>_>_>
          ::equal_range(in_RDX,(key_type *)
                               matchRange.second.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_DirectiveEntry>,_true>
                               ._M_cur);
    directive = (DirectiveEntry *)
                it.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_DirectiveEntry>,_true>
                ._M_cur;
    while (bVar1 = std::__detail::operator!=
                             ((_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_DirectiveEntry>,_true>
                               *)&directive,
                              (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_DirectiveEntry>,_true>
                               *)&matchRange), bVar1) {
      pvVar2 = std::__detail::
               _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_DirectiveEntry>,_false,_true>
               ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_DirectiveEntry>,_false,_true>
                             *)&directive);
      result._M_t.super___uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>.
      _M_t.super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
      super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl =
           (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
           &pvVar2->second;
      if ((((((pvVar2->second).flags & 0x80000U) == 0) &&
           ((((pvVar2->second).flags & 0x20000U) == 0 || ((Global.nocash & 1U) == 0)))) &&
          ((((pvVar2->second).flags & 0x10000U) == 0 || ((Global.nocash & 1U) != 0)))) &&
         ((((pvVar2->second).flags & 0x100000U) == 0 || ((Global.memoryMode & 1U) == 0)))) {
        if (((pvVar2->second).flags & 0x40000U) != 0) {
          pAVar3 = Architecture::current();
          (*pAVar3->_vptr_Architecture[3])();
        }
        eatToken((Parser *)directiveSet);
        (**(code **)result._M_t.
                    super___uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>
                    .super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl)
                  (&local_58,directiveSet,
                   *(undefined4 *)
                    ((long)result._M_t.
                           super___uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>
                           .super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl + 8));
        bVar1 = std::operator==(&local_58,(nullptr_t)0x0);
        if (bVar1) {
          bVar1 = hasError((Parser *)directiveSet);
          if (!bVar1) {
            printError<>((Parser *)directiveSet,this_00,"Directive parameter failure");
          }
          std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
          unique_ptr<std::default_delete<CAssemblerCommand>,void>
                    ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)this,
                     (nullptr_t)0x0);
        }
        else if (((*(uint *)((long)result._M_t.
                                   super___uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>
                                   .super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl +
                            8) & 0x200000) == 0) &&
                (pTVar4 = nextToken((Parser *)directiveSet), pTVar4->type != Separator)) {
          printError<>((Parser *)directiveSet,this_00,"Directive not terminated");
          std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
          unique_ptr<std::default_delete<CAssemblerCommand>,void>
                    ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)this,
                     (nullptr_t)0x0);
        }
        else {
          std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::unique_ptr
                    ((unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *)this,
                     &local_58);
        }
        std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::~unique_ptr
                  (&local_58);
        return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>
                )(__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>
                  )this;
      }
      std::__detail::
      _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_DirectiveEntry>,_false,_true>
      ::operator++((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_DirectiveEntry>,_false,_true>
                    *)&directive);
    }
    std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
    unique_ptr<std::default_delete<CAssemblerCommand>,void>
              ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)this,
               (nullptr_t)0x0);
  }
  else {
    std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
    unique_ptr<std::default_delete<CAssemblerCommand>,void>
              ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)this,
               (nullptr_t)0x0);
  }
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<CAssemblerCommand> Parser::parseDirective(const DirectiveMap &directiveSet)
{
	const Token &tok = peekToken();
	if (tok.type != TokenType::Identifier)
		return nullptr;

	const std::string &stringValue = tok.identifierValue().string();

	auto matchRange = directiveSet.equal_range(stringValue);
	for (auto it = matchRange.first; it != matchRange.second; ++it)
	{
		const DirectiveEntry &directive = it->second;

		if (directive.flags & DIRECTIVE_DISABLED)
			continue;
		if ((directive.flags & DIRECTIVE_NOCASHOFF) && Global.nocash)
			continue;
		if ((directive.flags & DIRECTIVE_NOCASHON) && !Global.nocash)
			continue;
		if ((directive.flags & DIRECTIVE_NOTINMEMORY) && Global.memoryMode)
			continue;

		if (directive.flags & DIRECTIVE_MIPSRESETDELAY)
			Architecture::current().NextSection();

		eatToken();
		std::unique_ptr<CAssemblerCommand> result = directive.function(*this,directive.flags);
		if (result == nullptr)
		{
			if (!hasError())
				printError(tok, "Directive parameter failure");
			return nullptr;
		} else if (!(directive.flags & DIRECTIVE_MANUALSEPARATOR) && nextToken().type != TokenType::Separator)
		{
			printError(tok, "Directive not terminated");
			return nullptr;
		}

		return result;
	}

	return nullptr;
}